

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
* doBuildInputVector(vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *__return_storage_ptr__,
                    vector<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
                    *images,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *texts)

{
  ushort uVar1;
  long lVar2;
  pointer pvVar3;
  vector<float,_std::allocator<float>_> *this;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  initializer_list<float> __l;
  long local_88;
  double local_80;
  vector<float,_std::allocator<float>_> HSI;
  value_type words;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar3 = (images->
           super__Vector_base<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_88 = 0;
  uVar5 = 0;
  for (uVar7 = 0;
      uVar7 < (ulong)(((long)*(pointer *)
                              ((long)&(pvVar3->
                                      super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                                      )._M_impl.super__Vector_impl_data + 8) -
                      *(long *)&(pvVar3->
                                super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                                )._M_impl.super__Vector_impl_data) / 3); uVar7 = uVar7 + 2) {
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::emplace_back<>(__return_storage_ptr__);
    uVar4 = 0;
    while( true ) {
      pvVar3 = (images->
               super__Vector_base<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(images->
                         super__Vector_base<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18) <=
          uVar4) break;
      for (lVar6 = 2; lVar6 != 8; lVar6 = lVar6 + 3) {
        lVar2 = *(long *)&(images->
                          super__Vector_base<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar4].
                          super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data + local_88;
        uVar1 = *(ushort *)(lVar6 + -2 + lVar2);
        auVar8._0_4_ = (float)(uVar1 & 0xff);
        auVar8._4_4_ = (float)(byte)(uVar1 >> 8);
        auVar8._8_8_ = 0;
        auVar8 = divps(auVar8,_DAT_0014f010);
        HSI.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = auVar8._0_8_;
        HSI.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = (float)*(byte *)(lVar6 + lVar2) / 255.0;
        __l._M_len = 3;
        __l._M_array = (iterator)&HSI.super__Vector_base<float,_std::allocator<float>_>;
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&words,__l,(allocator_type *)&local_80);
        RGB2HSI((vector<float,_std::allocator<float>_> *)
                &HSI.super__Vector_base<float,_std::allocator<float>_>,
                *(float *)words._M_dataplus._M_p,*(float *)(words._M_dataplus._M_p + 4),
                *(float *)(words._M_dataplus._M_p + 8));
        local_80 = (double)*HSI.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start / 6.283185307179586;
        std::vector<float,_std::allocator<float>_>::emplace_back<double>
                  ((__return_storage_ptr__->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish + -1,&local_80);
        std::vector<float,std::allocator<float>>::emplace_back<float&>
                  ((vector<float,std::allocator<float>> *)
                   ((__return_storage_ptr__->
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish + -1),
                   HSI.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + 1);
        std::vector<float,std::allocator<float>>::emplace_back<float&>
                  ((vector<float,std::allocator<float>> *)
                   ((__return_storage_ptr__->
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish + -1),
                   HSI.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + 2);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&HSI.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&words);
      }
      std::__cxx11::string::string
                ((string *)&words,
                 (string *)
                 ((texts->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar4));
      this = (__return_storage_ptr__->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish + -1;
      if (uVar5 < words._M_string_length) {
        HSI.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(HSI.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     (float)(int)words._M_dataplus._M_p[uVar5] / 255.0);
        std::vector<float,_std::allocator<float>_>::emplace_back<float>
                  (this,(float *)&HSI.super__Vector_base<float,_std::allocator<float>_>);
      }
      else {
        HSI.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)((ulong)HSI.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_ << 0x20);
        std::vector<float,_std::allocator<float>_>::emplace_back<int>
                  (this,(int *)&HSI.super__Vector_base<float,_std::allocator<float>_>);
      }
      std::__cxx11::string::~string((string *)&words);
      uVar4 = uVar4 + 1;
    }
    uVar5 = uVar5 + 1;
    local_88 = local_88 + 6;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<float>> doBuildInputVector(std::vector<BMPImage> &images, std::vector<std::string> &texts) {
    std::vector<std::vector<float>> input;
    for (int d = 0,t = 0; d < images[0].size(); d+=2, t++) {
        input.emplace_back();
        for (int i = 0; i < images.size(); i++) {
            for (int s = 0; s < 2; s++) {
                float r = images[i][d+s][0];
                float g = images[i][d+s][1];
                float b = images[i][d+s][2];
                auto rgbn = std::vector<float>({r/255, g/255, b/255});
                auto HSI = RGB2HSI(rgbn[0], rgbn[1], rgbn[2]);
                input.back().emplace_back(HSI[0]/(2*M_PI));
                input.back().emplace_back(HSI[1]);
                input.back().emplace_back(HSI[2]);
            }

            auto words = texts[i];
            if (t < words.size()) input.back().emplace_back(float(words[t])/255);
            else input.back().emplace_back(0);
        }
    }
    return input;
}